

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_Include::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  Template *pTVar14;
  allocator local_2a1;
  TemplateString local_2a0;
  TemplateDictionary dict;
  string incname;
  uint7 uStack_1df;
  uint7 uStack_1bf;
  uint7 uStack_19f;
  uint7 uStack_17f;
  uint7 uStack_15f;
  string incname_bad;
  string incname2;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateString local_b0;
  TemplateString local_90;
  TemplateString local_70;
  TemplateString local_50;
  TemplateString local_30;
  
  std::__cxx11::string::string((string *)&dict,"include file\n",(allocator *)&incname2);
  ctemplate::StringToTemplateFile(&incname,(string *)&dict);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string((string *)&dict,"inc2a\ninc2b\n",(allocator *)&incname_bad);
  ctemplate::StringToTemplateFile(&incname2,(string *)&dict);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string((string *)&dict,"{{syntax_error",(allocator *)&local_2a0);
  ctemplate::StringToTemplateFile(&incname_bad,(string *)&dict);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string((string *)&dict,"hi {{>INC}} bar\n",(allocator *)&local_2a0);
  pTVar14 = ctemplate::StringToTemplate((string *)&dict,STRIP_WHITESPACE);
  std::__cxx11::string::~string((string *)&dict);
  ctemplate::TemplateString::TemplateString(&local_2a0,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_2a0,(UnsafeArena *)0x0);
  std::__cxx11::string::string((string *)&local_2a0,"hi  bar",&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,true);
  std::__cxx11::string::~string((string *)&local_2a0);
  ctemplate::TemplateString::TemplateString(&local_30,"INC");
  TVar1.length_ = local_30.length_;
  TVar1.ptr_ = local_30.ptr_;
  TVar1.is_immutable_ = local_30.is_immutable_;
  TVar1._17_7_ = local_30._17_7_;
  TVar1.id_ = local_30.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  std::__cxx11::string::string((string *)&local_2a0,"hi  bar",&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,true);
  std::__cxx11::string::~string((string *)&local_2a0);
  ctemplate::TemplateString::TemplateString(&local_50,"INC");
  TVar2.length_ = local_50.length_;
  TVar2.ptr_ = local_50.ptr_;
  TVar2.is_immutable_ = local_50.is_immutable_;
  TVar2._17_7_ = local_50._17_7_;
  TVar2.id_ = local_50.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar2);
  ctemplate::TemplateString::TemplateString(&local_70,"/notarealfile ");
  TVar3.length_ = local_70.length_;
  TVar3.ptr_ = local_70.ptr_;
  TVar3.is_immutable_ = local_70.is_immutable_;
  TVar3._17_7_ = local_70._17_7_;
  TVar3.id_ = local_70.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar3);
  std::__cxx11::string::string((string *)&local_2a0,"hi  bar",&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  ctemplate::TemplateString::TemplateString(&local_90,"INC");
  TVar4.length_ = local_90.length_;
  TVar4.ptr_ = local_90.ptr_;
  TVar4.is_immutable_ = local_90.is_immutable_;
  TVar4._17_7_ = local_90._17_7_;
  TVar4.id_ = local_90.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar4);
  TVar5.length_ = incname._M_string_length;
  TVar5.ptr_ = incname._M_dataplus._M_p;
  TVar5._16_8_ = (ulong)uStack_15f << 8;
  TVar5.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar5);
  std::__cxx11::string::string((string *)&local_2a0,"hi include file bar",&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  ctemplate::TemplateString::TemplateString(&local_b0,"INC");
  TVar6.length_ = local_b0.length_;
  TVar6.ptr_ = local_b0.ptr_;
  TVar6.is_immutable_ = local_b0.is_immutable_;
  TVar6._17_7_ = local_b0._17_7_;
  TVar6.id_ = local_b0.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar6);
  TVar7.length_ = incname_bad._M_string_length;
  TVar7.ptr_ = incname_bad._M_dataplus._M_p;
  TVar7._16_8_ = (ulong)uStack_17f << 8;
  TVar7.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar7);
  std::__cxx11::string::string((string *)&local_2a0,"hi include file bar",&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  ctemplate::TemplateString::TemplateString(&local_d0,"INC");
  TVar8.length_ = local_d0.length_;
  TVar8.ptr_ = local_d0.ptr_;
  TVar8.is_immutable_ = local_d0.is_immutable_;
  TVar8._17_7_ = local_d0._17_7_;
  TVar8.id_ = local_d0.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar8);
  TVar9.length_ = incname._M_string_length;
  TVar9.ptr_ = incname._M_dataplus._M_p;
  TVar9._16_8_ = (ulong)uStack_19f << 8;
  TVar9.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar9);
  std::__cxx11::string::string((string *)&local_2a0,"hi include fileinclude file bar",&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  ctemplate::TemplateString::TemplateString(&local_f0,"inc");
  TVar10.length_ = local_f0.length_;
  TVar10.ptr_ = local_f0.ptr_;
  TVar10.is_immutable_ = local_f0.is_immutable_;
  TVar10._17_7_ = local_f0._17_7_;
  TVar10.id_ = local_f0.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar10);
  TVar11.length_ = incname._M_string_length;
  TVar11.ptr_ = incname._M_dataplus._M_p;
  TVar11._16_8_ = (ulong)uStack_1bf << 8;
  TVar11.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar11);
  std::__cxx11::string::string((string *)&local_2a0,"hi include fileinclude file bar",&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  ctemplate::TemplateString::TemplateString(&local_110,"INC");
  TVar12.length_ = local_110.length_;
  TVar12.ptr_ = local_110.ptr_;
  TVar12.is_immutable_ = local_110.is_immutable_;
  TVar12._17_7_ = local_110._17_7_;
  TVar12.id_ = local_110.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar12);
  TVar13.length_ = incname2._M_string_length;
  TVar13.ptr_ = incname2._M_dataplus._M_p;
  TVar13._16_8_ = (ulong)uStack_1df << 8;
  TVar13.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar13);
  std::__cxx11::string::string
            ((string *)&local_2a0,"hi include fileinclude fileinc2ainc2b bar",&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"hi {{>INC}} bar",&local_2a1);
  pTVar14 = ctemplate::StringToTemplate((string *)&local_2a0,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string
            ((string *)&local_2a0,"hi include file\ninclude file\ninc2a\ninc2b\n bar",&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"hi\n  {{>INC}} bar",&local_2a1);
  pTVar14 = ctemplate::StringToTemplate((string *)&local_2a0,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string
            ((string *)&local_2a0,"hi\n  include file\n  include file\n  inc2a\n  inc2b\n   bar",
             &local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"hi\n  {{>INC}} bar",&local_2a1);
  pTVar14 = ctemplate::StringToTemplate((string *)&local_2a0,STRIP_WHITESPACE);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string
            ((string *)&local_2a0,"hiinclude fileinclude fileinc2ainc2b bar",&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"hi\n - {{>INC}} bar",&local_2a1);
  pTVar14 = ctemplate::StringToTemplate((string *)&local_2a0,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string
            ((string *)&local_2a0,"hi\n - include file\ninclude file\ninc2a\ninc2b\n bar",&local_2a1
            );
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"  {{>INC}}\nbar",&local_2a1);
  pTVar14 = ctemplate::StringToTemplate((string *)&local_2a0,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string
            ((string *)&local_2a0,"  include file\n  include file\n  inc2a\n  inc2b\n  \nbar",
             &local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"  {{>INC}}-{{>INC}}",&local_2a1);
  pTVar14 = ctemplate::StringToTemplate((string *)&local_2a0,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string
            ((string *)&local_2a0,
             "  include file\n  include file\n  inc2a\n  inc2b\n  -include file\ninclude file\ninc2a\ninc2b\n"
             ,&local_2a1);
  ctemplate::AssertExpandIs(pTVar14,&dict,(string *)&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
  std::__cxx11::string::~string((string *)&incname_bad);
  std::__cxx11::string::~string((string *)&incname2);
  std::__cxx11::string::~string((string *)&incname);
  return;
}

Assistant:

TEST(Template, Include) {
  string incname = StringToTemplateFile("include file\n");
  string incname2 = StringToTemplateFile("inc2a\ninc2b\n");
  string incname_bad = StringToTemplateFile("{{syntax_error");
  Template* tpl = StringToTemplate("hi {{>INC}} bar\n", STRIP_WHITESPACE);
  TemplateDictionary dict("dict");
  AssertExpandIs(tpl, &dict, "hi  bar", true);
  dict.AddIncludeDictionary("INC");
  AssertExpandIs(tpl, &dict, "hi  bar", true);   // noop: no filename was set
  dict.AddIncludeDictionary("INC")->SetFilename("/notarealfile ");
  AssertExpandIs(tpl, &dict, "hi  bar", false);   // noop: illegal filename
  dict.AddIncludeDictionary("INC")->SetFilename(incname);
  AssertExpandIs(tpl, &dict, "hi include file bar", false);
  dict.AddIncludeDictionary("INC")->SetFilename(incname_bad);
  AssertExpandIs(tpl, &dict, "hi include file bar",
                 false);  // noop: syntax error
  dict.AddIncludeDictionary("INC")->SetFilename(incname);
  AssertExpandIs(tpl, &dict, "hi include fileinclude file bar", false);
  dict.AddIncludeDictionary("inc")->SetFilename(incname);
  AssertExpandIs(tpl, &dict, "hi include fileinclude file bar", false);
  dict.AddIncludeDictionary("INC")->SetFilename(incname2);
  AssertExpandIs(tpl, &dict,
                 "hi include fileinclude fileinc2ainc2b bar", false);

  // Now test that includes preserve Strip
  Template* tpl2 = StringToTemplate("hi {{>INC}} bar", DO_NOT_STRIP);
  AssertExpandIs(tpl2, &dict,
                 "hi include file\ninclude file\ninc2a\ninc2b\n bar", false);

  // Test that if we indent the include, every line on the include
  // is indented.
  Template* tpl3 = StringToTemplate("hi\n  {{>INC}} bar", DO_NOT_STRIP);
  AssertExpandIs(tpl3, &dict,
                 "hi\n  include file\n  include file\n"
                 "  inc2a\n  inc2b\n   bar",
                 false);
  // But obviously, if we strip leading whitespace, no indentation.
  Template* tpl4 = StringToTemplate("hi\n  {{>INC}} bar", STRIP_WHITESPACE);
  AssertExpandIs(tpl4, &dict,
                 "hiinclude fileinclude fileinc2ainc2b bar", false);
  // And if it's not a whitespace indent, we don't indent either.
  Template* tpl5 = StringToTemplate("hi\n - {{>INC}} bar", DO_NOT_STRIP);
  AssertExpandIs(tpl5, &dict,
                 "hi\n - include file\ninclude file\n"
                 "inc2a\ninc2b\n bar",
                 false);
  // Make sure we indent properly at the beginning.
  Template* tpl6 = StringToTemplate("  {{>INC}}\nbar", DO_NOT_STRIP);
  AssertExpandIs(tpl6, &dict,
                 "  include file\n  include file\n"
                 "  inc2a\n  inc2b\n  \nbar",
                 false);
  // And deal correctly when we include twice in a row.
  Template* tpl7 = StringToTemplate("  {{>INC}}-{{>INC}}", DO_NOT_STRIP);
  AssertExpandIs(tpl7, &dict,
                 "  include file\n  include file\n  inc2a\n  inc2b\n  "
                 "-include file\ninclude file\ninc2a\ninc2b\n",
                 false);
}